

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

void tcg_dump_ops_arm(TCGContext_conflict *s,_Bool have_prefs,char *headline)

{
  ulong uVar1;
  TCGOp *op;
  int iVar2;
  
  fprintf(_stderr,"\n*** %s\n");
  op = (s->ops).tqh_first;
  if (op != (TCGOp *)0x0) {
    iVar2 = 0;
    uVar1 = 0;
    do {
      if (*(char *)op == -0x7f) {
        fprintf(_stderr,"\n insn_idx=%d",uVar1);
        uVar1 = (ulong)((int)uVar1 + 1);
        iVar2 = 1;
      }
      else {
        fprintf(_stderr," %d: ",iVar2);
        iVar2 = iVar2 + 1;
      }
      tcg_dump_op_arm(s,have_prefs,op);
      op = (op->link).tqe_next;
    } while (op != (TCGOp *)0x0);
  }
  return;
}

Assistant:

void tcg_dump_ops(TCGContext *s, bool have_prefs, const char *headline)
{
    TCGOp *op;
    int insn_idx = 0;
    int op_idx = 0;

    fprintf(stderr, "\n*** %s\n", headline);
    // tcg_dump_tbs(s, tcg_dump_tb, NULL);

    QTAILQ_FOREACH(op, &s->ops, link) {
        if (op->opc == INDEX_op_insn_start) {
            fprintf(stderr, "\n insn_idx=%d", insn_idx);
            insn_idx++;
            op_idx = 0;
        } else {
            fprintf(stderr, " %d: ", op_idx);
        }
        op_idx++;
        tcg_dump_op(s, have_prefs, op);
    }
}